

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vcd_trace.cpp
# Opt level: O0

void __thiscall sc_core::vcd_trace_file::cycle(vcd_trace_file *this,bool this_is_a_delta_cycle)

{
  vcd_trace *pvVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  uint64 uVar5;
  reference ppvVar6;
  size_type sVar7;
  byte in_SIL;
  sc_trace_file_base *in_RDI;
  vcd_trace *t;
  int i;
  vcd_trace **l_traces;
  bool time_printed;
  stringstream ss_1;
  stringstream ss;
  bool time_advanced;
  unit_type now_units_low;
  unit_type now_units_high;
  undefined4 in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbac;
  ostream *in_stack_fffffffffffffbb0;
  unit_type *in_stack_fffffffffffffbb8;
  vcd_trace_file *in_stack_fffffffffffffbc0;
  int in_stack_fffffffffffffc24;
  int iVar8;
  int iVar9;
  char *in_stack_fffffffffffffc28;
  undefined7 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc37;
  byte bVar10;
  char *in_stack_fffffffffffffc38;
  sc_severity in_stack_fffffffffffffc44;
  stringstream local_3a8 [16];
  ostream local_398 [328];
  unit_type in_stack_fffffffffffffdb0;
  sc_trace_file_base *in_stack_fffffffffffffdb8;
  vcd_trace_file *in_stack_fffffffffffffdc0;
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [40];
  unit_type in_stack_fffffffffffffe48;
  stringstream local_1b0 [16];
  ostream local_1a0 [383];
  byte local_21;
  _func_int **local_20;
  _func_int **local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  bVar2 = sc_trace_file_base::delta_cycles(in_RDI);
  if (((bVar2) || ((local_9 & 1) == 0)) &&
     (bVar2 = sc_trace_file_base::initialize(in_stack_fffffffffffffdb8), !bVar2)) {
    local_21 = get_time_stamp(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                              (unit_type *)in_stack_fffffffffffffbb0);
    bVar2 = sc_trace_file_base::has_low_units(in_RDI);
    if ((!bVar2) && (local_20 != (_func_int **)0x0)) {
      std::__cxx11::stringstream::stringstream(local_1b0);
      std::operator<<(local_1a0,"\n\tCurrent kernel time is ");
      sc_time_stamp();
      sc_core::operator<<(in_stack_fffffffffffffbb0,
                          (sc_time *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
      poVar4 = std::operator<<(local_1a0,"\n\tVCD trace time unit is ");
      sc_trace_file_base::fs_unit_to_str_abi_cxx11_(in_stack_fffffffffffffe48);
      std::operator<<(poVar4,local_1e0);
      std::__cxx11::string::~string(local_1e0);
      std::operator<<(local_1a0,
                      "\n\tUse \'tracefile->set_time_unit(double, sc_time_unit);\' to increase the time resolution."
                     );
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      sc_report_handler::report
                (in_stack_fffffffffffffc44,in_stack_fffffffffffffc38,
                 (char *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                 in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
      std::__cxx11::string::~string(local_200);
      std::__cxx11::stringstream::~stringstream(local_1b0);
    }
    bVar2 = sc_trace_file_base::delta_cycles(in_RDI);
    if (bVar2) {
      if ((local_9 & 1) != 0) {
        if ((cycle::warned & 1U) == 0) {
          sc_trace_file_base::fs_unit_to_str_abi_cxx11_(in_stack_fffffffffffffe48);
          std::__cxx11::string::c_str();
          sc_report_handler::report
                    (in_stack_fffffffffffffc44,in_stack_fffffffffffffc38,
                     (char *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                     in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
          std::__cxx11::string::~string(local_220);
          cycle::warned = true;
        }
        uVar5 = sc_delta_count_at_current_time();
        if ((uVar5 == 0) && ((local_21 & 1) == 0)) {
          std::__cxx11::stringstream::stringstream(local_3a8);
          poVar4 = std::operator<<(local_398,
                                   "\n\tThis can occur when delta cycle tracing is activated.");
          std::operator<<(poVar4,"\n\tSome delta cycles at ");
          sc_time_stamp();
          poVar4 = sc_core::operator<<(in_stack_fffffffffffffbb0,
                                       (sc_time *)
                                       CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8)
                                      );
          poVar4 = std::operator<<(poVar4," are not shown in vcd.");
          std::operator<<(poVar4,
                          "\n\tUse \'tracefile->set_time_unit(double, sc_time_unit);\' to increase the time resolution."
                         );
          std::__cxx11::stringstream::str();
          std::__cxx11::string::c_str();
          sc_report_handler::report
                    (in_stack_fffffffffffffc44,in_stack_fffffffffffffc38,
                     (char *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                     in_stack_fffffffffffffc28,in_stack_fffffffffffffc24);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffc38);
          std::__cxx11::stringstream::~stringstream(local_3a8);
          return;
        }
      }
      if ((local_9 & 1) == 0) {
        if ((local_21 & 1) == 0) {
          return;
        }
        in_RDI[1].super_sc_object._vptr_sc_object = local_18;
        in_RDI[1].super_sc_trace_file._vptr_sc_trace_file = local_20;
        return;
      }
    }
    bVar10 = 0;
    ppvVar6 = std::vector<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_>::operator[]
                        ((vector<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_> *)
                         &in_RDI[1].super_sc_object.m_attr_cltn_p,0);
    iVar8 = 0;
    while (iVar9 = iVar8,
          sVar7 = std::vector<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_>::size
                            ((vector<sc_core::vcd_trace_*,_std::allocator<sc_core::vcd_trace_*>_> *)
                             &in_RDI[1].super_sc_object.m_attr_cltn_p), iVar8 < (int)sVar7) {
      pvVar1 = ppvVar6[iVar9];
      uVar3 = (*pvVar1->_vptr_vcd_trace[2])();
      if ((uVar3 & 1) != 0) {
        if ((bVar10 & 1) == 0) {
          print_time_stamp(in_stack_fffffffffffffdc0,(unit_type)in_stack_fffffffffffffdb8,
                           in_stack_fffffffffffffdb0);
          bVar10 = 1;
        }
        (**pvVar1->_vptr_vcd_trace)(pvVar1,in_RDI->fp);
        fputc(10,(FILE *)in_RDI->fp);
      }
      iVar8 = iVar9 + 1;
    }
    if ((bVar10 & 1) != 0) {
      fputc(10,(FILE *)in_RDI->fp);
    }
  }
  return;
}

Assistant:

void
vcd_trace_file::cycle(bool this_is_a_delta_cycle)
{
    // Trace delta cycles only when enabled
    if (!delta_cycles() && this_is_a_delta_cycle) return;

    // Check for initialization
    if( initialize() )
        return;

    unit_type now_units_high, now_units_low;

    bool time_advanced = get_time_stamp(now_units_high, now_units_low);

    if (!has_low_units() && (now_units_low != 0)) {
        std::stringstream ss;
        ss << "\n\tCurrent kernel time is " << sc_time_stamp();
        ss << "\n\tVCD trace time unit is " << fs_unit_to_str(trace_unit_fs);
        ss << "\n\tUse 'tracefile->set_time_unit(double, sc_time_unit);' to increase the time resolution.";
        SC_REPORT_WARNING( SC_ID_TRACING_VCD_TIME_RESOLUTION_, ss.str().c_str() );
    }

    if (delta_cycles()) {

        if(this_is_a_delta_cycle) {
            static bool warned = false;
            if(!warned){
                SC_REPORT_INFO( SC_ID_TRACING_VCD_DELTA_CYCLE_
                , fs_unit_to_str(trace_unit_fs).c_str() );
                warned = true;
            }

            if (sc_delta_count_at_current_time() == 0) {
                if(!time_advanced) {
                    std::stringstream ss;
                    ss <<"\n\tThis can occur when delta cycle tracing is activated."
                       <<"\n\tSome delta cycles at " << sc_time_stamp() << " are not shown in vcd."
                       <<"\n\tUse 'tracefile->set_time_unit(double, sc_time_unit);' to increase the time resolution.";
                    SC_REPORT_WARNING( SC_ID_TRACING_REVERSED_TIME_, ss.str().c_str() );

                    return;
                }
            }
        }

        if (!this_is_a_delta_cycle) {
            if (time_advanced) {
                previous_time_units_high = now_units_high;
                previous_time_units_low = now_units_low;
            }
            // Value updates can't happen during timed notification
            // so it is safe to skip printing
            return;
        }
    }

    // Now do the actual printing
    bool time_printed = false;
    vcd_trace* const* const l_traces = &traces[0];
    for (int i = 0; i < (int)traces.size(); i++) {
        vcd_trace* t = l_traces[i];
        if(t->changed()) {
            if(!time_printed){
                print_time_stamp(now_units_high, now_units_low);

                time_printed = true;
            }

            // Write the variable
            t->write(fp);
            std::fputc('\n', fp);
        }
    }
    // Put another newline after all values are printed
    if(time_printed) std::fputc('\n', fp);
}